

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O2

void slang::ast::ParameterBuilder::createDecls
               (Scope *scope,ParameterPortListSyntax *syntax,
               SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *results)

{
  size_t sVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  Scope *scope_00;
  bool bVar2;
  const_iterator __begin2;
  
  __begin2.index = 0;
  sVar1 = (syntax->declarations).elements._M_extent._M_extent_value;
  bVar2 = false;
  __begin2.list = &syntax->declarations;
  for (; (__begin2.list != &syntax->declarations || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    scope_00 = (Scope *)slang::syntax::
                        SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::
                        iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>::
                        dereference(&__begin2);
    if (scope_00->lastMember != (Symbol *)0x0) {
      bVar2 = *(short *)&scope_00->firstMember == 0xd2;
    }
    attributes._M_extent._M_extent_value = (size_t)__begin2.list;
    attributes._M_ptr = (pointer)results;
    createDecls((ParameterBuilder *)scope,scope_00,(ParameterDeclarationBaseSyntax *)(ulong)bVar2,
                true,false,attributes,
                (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)0x0);
  }
  return;
}

Assistant:

void ParameterBuilder::createDecls(const Scope& scope, const ParameterPortListSyntax& syntax,
                                   SmallVectorBase<Decl>& results) {
    bool lastLocal = false;
    for (auto declaration : syntax.declarations) {
        // It's legal to leave off the parameter keyword in the parameter port list.
        // If you do so, we "inherit" the parameter or localparam keyword from the
        // previous entry.
        if (declaration->keyword) {
            lastLocal = declaration->keyword.kind == parsing::TokenKind::LocalParamKeyword;
        }

        createDecls(scope, *declaration, lastLocal, /* isPort */ true, {}, results);
    }
}